

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

uint16_t __thiscall Handler::Purchase(Handler *this,VirtualMachine *vm)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  ushort uVar4;
  short sVar5;
  pointer pRVar6;
  pointer pDVar7;
  pointer pPVar8;
  pointer pMVar9;
  pointer pRVar10;
  pointer pSVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  undefined8 in_RAX;
  DeployedVirtualMachine *deployedVM;
  PurchasedServer *__args;
  pointer pDVar15;
  pointer pPVar16;
  MigrateResult *res;
  pointer pMVar17;
  pointer pRVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  uint8_t i;
  ulong uVar22;
  uint16_t uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined3 uStack_38;
  uint8_t serverIdx;
  uint local_34;
  
  bVar12 = this->N;
  bVar20 = bVar12 - 1;
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  uStack_38 = (undefined3)in_RAX;
  _uStack_38 = CONCAT13(bVar20,uStack_38);
  lVar24 = 0;
  for (uVar22 = 0; uVar22 < bVar12; uVar22 = uVar22 + 1) {
    bVar13 = CheckCapacity((Server *)
                           ((long)&(((this->servers).
                                     super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                                     super__Vector_impl_data._M_start)->model)._M_dataplus._M_p +
                           lVar24),vm);
    if (bVar13) {
      bVar20 = (byte)uVar22;
      _uStack_38 = CONCAT13(bVar20,uStack_38);
      break;
    }
    bVar12 = this->N;
    lVar24 = lVar24 + 0x38;
  }
  __args = (PurchasedServer *)operator_new(0x48);
  (__args->deployedVM)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__args->deployedVM)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(__args->deployedVM)._M_h._M_rehash_policy = 0;
  __args->id = 0;
  __args->serverIdx = '\0';
  __args->vacancyRate = '\0';
  __args->remainCpuCoreA = 0;
  __args->remainCpuCoreB = 0;
  __args->remainMemorySizeA = 0;
  __args->remainMemorySizeB = 0;
  *(undefined4 *)&__args->field_0xc = 0;
  (__args->deployedVM)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__args->deployedVM)._M_h._M_element_count = 0;
  (__args->deployedVM)._M_h._M_buckets = &(__args->deployedVM)._M_h._M_single_bucket;
  (__args->deployedVM)._M_h._M_bucket_count = 1;
  (__args->deployedVM)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__args->deployedVM)._M_h._M_rehash_policy._M_next_resize = 0;
  (__args->deployedVM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar4 = this->today;
  pRVar6 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar23 = this->totalPurchasedServerNum;
  lVar24 = *(long *)&pRVar6[uVar4].extendResult.
                     super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl;
  uVar22 = (ulong)((long)*(pointer *)
                          ((long)&pRVar6[uVar4].extendResult.
                                  super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>.
                                  _M_impl + 8) - lVar24) >> 2;
  uVar19 = 0;
  iVar14 = (int)uVar22;
  uVar21 = 0;
  if (0 < iVar14) {
    uVar21 = uVar22 & 0xffffffff;
  }
  do {
    if (uVar21 == uVar19) {
      _uStack_38 = CONCAT44(1,_uStack_38);
      std::vector<ExtendResult,std::allocator<ExtendResult>>::
      emplace_back<unsigned_char&,unsigned_int>
                ((vector<ExtendResult,std::allocator<ExtendResult>> *)(pRVar6 + uVar4),&serverIdx,
                 &stack0xffffffffffffffcc);
      bVar20 = serverIdx;
LAB_0010db84:
      __args->id = uVar23;
      __args->serverIdx = bVar20;
      pSVar11 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                super__Vector_impl_data._M_start + bVar20;
      uVar1 = pSVar11->cpuCore;
      uVar2 = pSVar11->memorySize;
      uVar3 = pSVar11->hardwareCost;
      auVar25._4_4_ = uVar3;
      auVar25._2_2_ = uVar2;
      auVar25._0_2_ = uVar1;
      auVar25._8_8_ = 0;
      auVar25 = pshuflw(auVar25,auVar25,0x50);
      __args->remainCpuCoreA = auVar25._0_2_ >> 1;
      __args->remainCpuCoreB = auVar25._2_2_ >> 1;
      __args->remainMemorySizeA = auVar25._4_2_ >> 1;
      __args->remainMemorySizeB = auVar25._6_2_ >> 1;
      this->purchasedServerIdxMap[uVar23] =
           (uint16_t)
           (((long)(this->purchasedServers).
                   super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->purchasedServers).
                  super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x48);
      std::vector<PurchasedServer,std::allocator<PurchasedServer>>::emplace_back<PurchasedServer&>
                ((vector<PurchasedServer,std::allocator<PurchasedServer>> *)&this->purchasedServers,
                 __args);
      this->totalHardwareCost =
           this->totalHardwareCost +
           (ulong)(this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                  super__Vector_impl_data._M_start[_uStack_38 >> 0x18 & 0xff].hardwareCost;
      return this->purchasedServerIdxMap[uVar23];
    }
    sVar5 = *(short *)(lVar24 + 2 + uVar19 * 4);
    uVar23 = uVar23 + sVar5;
    if (*(byte *)(lVar24 + uVar19 * 4) == bVar20) {
      *(short *)(lVar24 + 2 + uVar19 * 4) = sVar5 + 1;
      if ((int)uVar19 < iVar14 + -1) {
        pDVar7 = (this->deployedVMs).
                 super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pDVar15 = (this->deployedVMs).
                       super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                       ._M_impl.super__Vector_impl_data._M_start; pDVar15 != pDVar7;
            pDVar15 = pDVar15 + 1) {
          if (uVar23 <= pDVar15->purchasedServerId) {
            pDVar15->purchasedServerId = pDVar15->purchasedServerId + 1;
          }
        }
        pPVar8 = (this->purchasedServers).
                 super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pPVar16 = (this->purchasedServers).
                       super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl
                       .super__Vector_impl_data._M_start; pPVar16 != pPVar8; pPVar16 = pPVar16 + 1)
        {
          if (uVar23 <= pPVar16->id) {
            pPVar16->id = pPVar16->id + 1;
          }
        }
        ReMapPurchasedServerIdx(this);
        uVar4 = this->today;
        pRVar6 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar9 = *(pointer *)
                  ((long)&pRVar6[uVar4].migrateResult.
                          super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl
                  + 8);
        for (pMVar17 = pRVar6[uVar4].migrateResult.
                       super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl.
                       super__Vector_impl_data._M_start; pMVar17 != pMVar9; pMVar17 = pMVar17 + 1) {
          if (uVar23 <= pMVar17->purchasedServerId) {
            pMVar17->purchasedServerId = pMVar17->purchasedServerId + 1;
          }
        }
        pRVar10 = *(pointer *)
                   ((long)&pRVar6[uVar4].requestResult.
                           super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl
                   + 8);
        for (pRVar18 = pRVar6[uVar4].requestResult.
                       super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar18 != pRVar10; pRVar18 = pRVar18 + 1)
        {
          if (uVar23 <= pRVar18->purchasedServerId) {
            pRVar18->purchasedServerId = pRVar18->purchasedServerId + 1;
          }
        }
      }
      goto LAB_0010db84;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

uint16_t Handler::Purchase(const VirtualMachine &vm) {
    uint8_t serverIdx = N - 1u;
    for (uint8_t i = 0u; i < N; ++i) {
        Server &server = servers[i];
        if (CheckCapacity(server, vm)) {
            serverIdx = i;
            break;
        }
    }

    auto *purchasedServer = new PurchasedServer();
    std::vector<ExtendResult> &extendResult = result[today].extendResult;
    uint16_t id = totalPurchasedServerNum;
    int resultIdx = 0, n = (int) extendResult.size();
    bool exist = false;
    for (int i = 0; i < n; ++i) {
        id += extendResult[i].purchaseNum;
        if (extendResult[i].serverIdx == serverIdx) {   // 买过同一型号的 server
            ++extendResult[i].purchaseNum;   // 数量加一表示多买一个
            exist = true;
            resultIdx = i;
            break;
        }
    }

    // 已经购买过这一类型的服务器
    if (exist) {
        if (resultIdx < n - 1) {  // 不是 extendResult 中的最后一个种类
            for (DeployedVirtualMachine &deployedVM : deployedVMs) {
                if (deployedVM.purchasedServerId >= id) ++deployedVM.purchasedServerId;
            }
            for (PurchasedServer &item : purchasedServers) {
                if (item.id >= id) ++item.id;
            }
            ReMapPurchasedServerIdx();

            std::vector<MigrateResult> &migrateResult = result[today].migrateResult;
            for (MigrateResult &res : migrateResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
            std::vector<RequestResult> &requestResult = result[today].requestResult;
            for (RequestResult &res : requestResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
        }
    } else {
        extendResult.emplace_back(serverIdx, 1u);
    }

    purchasedServer->id = id;
    purchasedServer->serverIdx = serverIdx;
    purchasedServer->remainCpuCoreA = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainCpuCoreB = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainMemorySizeA = (servers[serverIdx].memorySize >> 1u);
    purchasedServer->remainMemorySizeB = (servers[serverIdx].memorySize >> 1u);
    purchasedServerIdxMap[id] = purchasedServers.size();
    purchasedServers.emplace_back(*purchasedServer);

#ifdef TEST
    totalHardwareCost += servers[serverIdx].hardwareCost;
#endif

    return purchasedServerIdxMap[id];
}